

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysisbase.h
# Opt level: O2

void __thiscall ICM::Compiler::AnalysisBase::printTable(AnalysisBase *this)

{
  pointer puVar1;
  Node *in_RDX;
  Node *extraout_RDX;
  pointer puVar2;
  string sStack_38;
  
  puVar1 = (this->Table->
           super__Vector_base<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (this->Table->
           super__Vector_base<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start + 1;
  if (puVar1 <= puVar2) {
    puVar2 = puVar1;
  }
  for (; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    ICM::to_string_abi_cxx11_
              (&sStack_38,
               (ICM *)(puVar2->_M_t).
                      super___uniq_ptr_impl<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ICM::ASTBase::Node_*,_std::default_delete<ICM::ASTBase::Node>_>
                      .super__Head_base<0UL,_ICM::ASTBase::Node_*,_false>._M_head_impl,in_RDX);
    println<std::__cxx11::string>(&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
    in_RDX = extraout_RDX;
  }
  return;
}

Assistant:

void printTable() {
				for (auto &e : rangei(Table.begin() + 1, Table.end()))
					println(ICM::to_string(*e));
			}